

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_geometric_normal_decoder.h
# Opt level: O3

bool __thiscall
draco::
MeshPredictionSchemeGeometricNormalDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
::SetParentAttribute
          (MeshPredictionSchemeGeometricNormalDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
           *this,PointAttribute *att)

{
  if (((att->super_GeometryAttribute).attribute_type_ == POSITION) &&
     ((att->super_GeometryAttribute).num_components_ == '\x03')) {
    (this->predictor_).
    super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    .pos_attribute_ = att;
    return true;
  }
  return false;
}

Assistant:

bool SetParentAttribute(const PointAttribute *att) override {
    if (att->attribute_type() != GeometryAttribute::POSITION) {
      return false;  // Invalid attribute type.
    }
    if (att->num_components() != 3) {
      return false;  // Currently works only for 3 component positions.
    }
    predictor_.SetPositionAttribute(*att);
    return true;
  }